

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,mbedtls_cipher_info_t *cipher_info)

{
  void *pvVar1;
  mbedtls_cipher_info_t *cipher_info_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if ((cipher_info == (mbedtls_cipher_info_t *)0x0) || (ctx == (mbedtls_cipher_context_t *)0x0)) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    memset(ctx,0,0x58);
    pvVar1 = (*cipher_info->base->ctx_alloc_func)();
    ctx->cipher_ctx = pvVar1;
    if (pvVar1 == (void *)0x0) {
      ctx_local._4_4_ = -0x6180;
    }
    else {
      ctx->cipher_info = cipher_info;
      mbedtls_cipher_set_padding_mode(ctx,MBEDTLS_PADDING_PKCS7);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_setup( mbedtls_cipher_context_t *ctx, const mbedtls_cipher_info_t *cipher_info )
{
    if( NULL == cipher_info || NULL == ctx )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    memset( ctx, 0, sizeof( mbedtls_cipher_context_t ) );

    if( NULL == ( ctx->cipher_ctx = cipher_info->base->ctx_alloc_func() ) )
        return( MBEDTLS_ERR_CIPHER_ALLOC_FAILED );

    ctx->cipher_info = cipher_info;

#if defined(MBEDTLS_CIPHER_MODE_WITH_PADDING)
    /*
     * Ignore possible errors caused by a cipher mode that doesn't use padding
     */
#if defined(MBEDTLS_CIPHER_PADDING_PKCS7)
    (void) mbedtls_cipher_set_padding_mode( ctx, MBEDTLS_PADDING_PKCS7 );
#else
    (void) mbedtls_cipher_set_padding_mode( ctx, MBEDTLS_PADDING_NONE );
#endif
#endif /* MBEDTLS_CIPHER_MODE_WITH_PADDING */

    return( 0 );
}